

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O3

bool __thiscall
Fossilize::StateReplayer::Impl::parse_stages
          (Impl *this,StateCreatorInterface *iface,DatabaseInterface *resolver,Value *stages,
          VkPipelineShaderStageCreateInfo **out_info)

{
  size_t size;
  undefined8 uVar1;
  StateCreatorInterface *pSVar2;
  DatabaseInterface *resolver_00;
  bool bVar3;
  SizeType SVar4;
  int iVar5;
  ulong uVar6;
  GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
  *pGVar7;
  Type pGVar8;
  Ch *pCVar9;
  char *__dest;
  Number NVar10;
  VkShaderModule pVVar11;
  _Node_iterator_base<std::pair<const_unsigned_long,_VkShaderModule_T_*>,_false> _Var12;
  GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
  *this_00;
  VkSpecializationInfo **ppVVar13;
  long *in_FS_OFFSET;
  uint64_t module;
  vector<unsigned_char,_std::allocator<unsigned_char>_> external_state;
  size_t external_state_size;
  VkShaderModule local_98;
  allocator_type local_89;
  VkPipelineShaderStageCreateInfo *local_88;
  VkSpecializationInfo **local_80;
  Data local_78;
  long local_68;
  StateCreatorInterface *local_60;
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_VkShaderModule_T_*>,_std::allocator<std::pair<const_unsigned_long,_VkShaderModule_T_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *local_58;
  size_type local_50;
  VkPipelineShaderStageCreateInfo **local_48;
  DatabaseInterface *local_40;
  Value *local_38;
  
  local_60 = iface;
  local_40 = resolver;
  if ((stages->data_).f.flags != 4) {
    __assert_fail("IsArray()",
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/rapidjson/include/rapidjson/document.h"
                  ,0x66a,
                  "SizeType rapidjson::GenericValue<rapidjson::UTF8<>>::Size() const [Encoding = rapidjson::UTF8<>, Allocator = rapidjson::MemoryPoolAllocator<>]"
                 );
  }
  uVar6 = (ulong)(stages->data_).s.length;
  local_48 = out_info;
  if (uVar6 == 0) {
    local_88 = (VkPipelineShaderStageCreateInfo *)0x0;
  }
  else {
    size = uVar6 * 0x30;
    local_88 = (VkPipelineShaderStageCreateInfo *)
               ScratchAllocator::allocate_raw(&this->allocator,size,0x10);
    if (local_88 != (VkPipelineShaderStageCreateInfo *)0x0) {
      memset(local_88,0,size);
    }
    if ((stages->data_).f.flags != 4) {
      __assert_fail("IsArray()",
                    "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/rapidjson/include/rapidjson/document.h"
                    ,0x68c,
                    "ValueIterator rapidjson::GenericValue<rapidjson::UTF8<>>::Begin() [Encoding = rapidjson::UTF8<>, Allocator = rapidjson::MemoryPoolAllocator<>]"
                   );
    }
  }
  this_00 = (GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
             *)((ulong)(stages->data_).s.str & 0xffffffffffff);
  pGVar7 = (GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
            *)rapidjson::
              GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              ::End(stages);
  if (pGVar7 != this_00) {
    local_58 = &(this->replayed_shader_modules)._M_h;
    ppVVar13 = &local_88->pSpecializationInfo;
    local_38 = stages;
    do {
      ((VkPipelineShaderStageCreateInfo *)(ppVVar13 + -5))->sType =
           VK_STRUCTURE_TYPE_PIPELINE_SHADER_STAGE_CREATE_INFO;
      pGVar8 = rapidjson::
               GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
               ::operator[]<char_const>(this_00,"flags");
      if ((undefined1  [16])((undefined1  [16])pGVar8->data_ & (undefined1  [16])0x40000000000000)
          == (undefined1  [16])0x0) {
LAB_0011c99e:
        __assert_fail("data_.f.flags & kUintFlag",
                      "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/rapidjson/include/rapidjson/document.h"
                      ,0x719,
                      "unsigned int rapidjson::GenericValue<rapidjson::UTF8<>>::GetUint() const [Encoding = rapidjson::UTF8<>, Allocator = rapidjson::MemoryPoolAllocator<>]"
                     );
      }
      *(SizeType *)(ppVVar13 + -3) = (pGVar8->data_).s.length;
      pGVar8 = rapidjson::
               GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
               ::operator[]<char_const>(this_00,"stage");
      if ((undefined1  [16])((undefined1  [16])pGVar8->data_ & (undefined1  [16])0x40000000000000)
          == (undefined1  [16])0x0) goto LAB_0011c99e;
      *(SizeType *)((long)ppVVar13 + -0x14) = (pGVar8->data_).s.length;
      pGVar8 = rapidjson::
               GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
               ::operator[]<char_const>(this_00,"name");
      pCVar9 = rapidjson::
               GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               ::GetString(pGVar8);
      local_80 = ppVVar13;
      pGVar8 = rapidjson::
               GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
               ::operator[]<char_const>(this_00,"name");
      SVar4 = rapidjson::
              GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              ::GetStringLength(pGVar8);
      uVar6 = (ulong)SVar4;
      __dest = (char *)ScratchAllocator::allocate_raw(&this->allocator,uVar6 + 1,0x10);
      ppVVar13 = local_80;
      memcpy(__dest,pCVar9,uVar6);
      __dest[uVar6] = '\0';
      ppVVar13[-1] = (VkSpecializationInfo *)__dest;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::FindMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                    *)&local_78.s,(Ch *)this_00);
      uVar1 = local_78.n;
      NVar10.i = (I)rapidjson::
                    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                    ::MemberEnd((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                                 *)this_00);
      if (uVar1 != NVar10.i64) {
        pGVar8 = rapidjson::
                 GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                 ::operator[]<char_const>(this_00,"specializationInfo");
        parse_specialization_info(this,pGVar8,ppVVar13);
      }
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::FindMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                    *)&local_78.s,(Ch *)this_00);
      uVar1 = local_78.n;
      NVar10.i = (I)rapidjson::
                    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                    ::MemberEnd((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                                 *)this_00);
      if (uVar1 != NVar10.i64) {
        pGVar8 = rapidjson::
                 GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                 ::operator[]<char_const>(this_00,"pNext");
        bVar3 = parse_pnext_chain(this,pGVar8,local_80 + -4,(StateCreatorInterface *)0x0,
                                  (DatabaseInterface *)0x0,(Value *)0x0);
        if (!bVar3) {
          return false;
        }
      }
      pGVar8 = rapidjson::
               GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
               ::operator[]<char_const>(this_00,"module");
      pCVar9 = rapidjson::
               GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               ::GetString(pGVar8);
      pVVar11 = (VkShaderModule)strtoull(pCVar9,(char **)0x0,0x10);
      local_98 = pVVar11;
      if ((pVVar11 != (VkShaderModule)0x0) && (this->resolve_shader_modules == true)) {
        _Var12._M_cur =
             (__node_type *)
             std::
             _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_VkShaderModule_T_*>,_std::allocator<std::pair<const_unsigned_long,_VkShaderModule_T_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
             ::find(local_58,(key_type *)&local_98);
        resolver_00 = local_40;
        if (_Var12._M_cur == (__node_type *)0x0) {
          local_50 = 0;
          if ((local_40 == (DatabaseInterface *)0x0) ||
             (iVar5 = (*local_40->_vptr_DatabaseInterface[3])(local_40,4,local_98,&local_50,0),
             (char)iVar5 == '\0')) {
            pVVar11 = local_98;
            if (1 < *(int *)(*in_FS_OFFSET + -0x18)) {
              return false;
            }
            bVar3 = Internal::log_thread_callback
                              (LOG_DEFAULT,
                               "Referenced %s %016lx, but it does not exist.\nThis can be expected when replaying an archive from Steam.\nIf replaying just the application cache, make sure to replay together with the common cache, as application cache can depend on common cache.\n"
                               ,"Shader module",local_98);
            if (bVar3) {
              return false;
            }
            fprintf(_stderr,
                    "Fossilize WARN: Referenced %s %016lx, but it does not exist.\nThis can be expected when replaying an archive from Steam.\nIf replaying just the application cache, make sure to replay together with the common cache, as application cache can depend on common cache.\n"
                    ,"Shader module",pVVar11);
            return false;
          }
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_78.s,local_50,
                     &local_89);
          iVar5 = (*resolver_00->_vptr_DatabaseInterface[3])
                            (resolver_00,4,local_98,&local_50,local_78.n.i64);
          pSVar2 = local_60;
          if ((char)iVar5 != '\0') {
            bVar3 = parse(this,local_60,resolver_00,(void *)local_78.n,
                          (long)local_78.s.str - local_78._0_8_);
            if (!bVar3) goto LAB_0011c95b;
            (*pSVar2->_vptr_StateCreatorInterface[0xf])(pSVar2);
            _Var12._M_cur =
                 (__node_type *)
                 std::
                 _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_VkShaderModule_T_*>,_std::allocator<std::pair<const_unsigned_long,_VkShaderModule_T_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 ::find(local_58,(key_type *)&local_98);
            if (_Var12._M_cur != (__node_type *)0x0) {
              if (local_78.n.i64 != 0) {
                operator_delete((void *)local_78.n,local_68 - local_78._0_8_);
              }
              goto LAB_0011c875;
            }
          }
          pVVar11 = local_98;
          if ((*(int *)(*in_FS_OFFSET + -0x18) < 2) &&
             (bVar3 = Internal::log_thread_callback
                                (LOG_DEFAULT,
                                 "Referenced %s %016lx, but it does not exist.\nThis can be expected when replaying an archive from Steam.\nIf replaying just the application cache, make sure to replay together with the common cache, as application cache can depend on common cache.\n"
                                 ,"Shader module",local_98), !bVar3)) {
            fprintf(_stderr,
                    "Fossilize WARN: Referenced %s %016lx, but it does not exist.\nThis can be expected when replaying an archive from Steam.\nIf replaying just the application cache, make sure to replay together with the common cache, as application cache can depend on common cache.\n"
                    ,"Shader module",pVVar11);
          }
LAB_0011c95b:
          if (local_78.n.i64 != 0) {
            operator_delete((void *)local_78.n,local_68 - local_78._0_8_);
          }
          return false;
        }
        (*local_60->_vptr_StateCreatorInterface[0xf])();
LAB_0011c875:
        pVVar11 = *(VkShaderModule *)
                   ((long)&((_Var12._M_cur)->
                           super__Hash_node_value<std::pair<const_unsigned_long,_VkShaderModule_T_*>,_false>
                           ).
                           super__Hash_node_value_base<std::pair<const_unsigned_long,_VkShaderModule_T_*>_>
                           ._M_storage._M_storage + 8);
      }
      ppVVar13 = local_80;
      local_80[-2] = (VkSpecializationInfo *)pVVar11;
      this_00 = this_00 + 0x10;
      pGVar7 = (GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                *)rapidjson::
                  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  ::End(local_38);
      ppVVar13 = ppVVar13 + 6;
    } while (this_00 != pGVar7);
  }
  *local_48 = local_88;
  return true;
}

Assistant:

bool StateReplayer::Impl::parse_stages(StateCreatorInterface &iface, DatabaseInterface *resolver, const Value &stages,
                                       const VkPipelineShaderStageCreateInfo **out_info)
{
	auto *state = allocator.allocate_n_cleared<VkPipelineShaderStageCreateInfo>(stages.Size());
	auto *ret = state;

	for (auto itr = stages.Begin(); itr != stages.End(); ++itr, state++)
	{
		auto &obj = *itr;
		state->sType = VK_STRUCTURE_TYPE_PIPELINE_SHADER_STAGE_CREATE_INFO;
		state->flags = obj["flags"].GetUint();
		state->stage = static_cast<VkShaderStageFlagBits>(obj["stage"].GetUint());
		state->pName = duplicate_string(obj["name"].GetString(), obj["name"].GetStringLength());
		if (obj.HasMember("specializationInfo"))
			if (!parse_specialization_info(obj["specializationInfo"], &state->pSpecializationInfo))
				return false;

		if (obj.HasMember("pNext"))
			if (!parse_pnext_chain(obj["pNext"], &state->pNext))
				return false;

		auto module = string_to_uint64(obj["module"].GetString());
		if (module > 0 && resolve_shader_modules)
		{
			auto module_iter = replayed_shader_modules.find(module);
			if (module_iter == replayed_shader_modules.end())
			{
				size_t external_state_size = 0;
				if (!resolver || !resolver->read_entry(RESOURCE_SHADER_MODULE, module, &external_state_size, nullptr,
				                                       PAYLOAD_READ_NO_FLAGS))
				{
					log_missing_resource("Shader module", module);
					return false;
				}

				vector<uint8_t> external_state(external_state_size);

				if (!resolver->read_entry(RESOURCE_SHADER_MODULE, module, &external_state_size, external_state.data(),
				                          PAYLOAD_READ_NO_FLAGS))
				{
					log_missing_resource("Shader module", module);
					return false;
				}

				if (!this->parse(iface, resolver, external_state.data(), external_state.size()))
					return false;

				iface.sync_shader_modules();
				module_iter = replayed_shader_modules.find(module);
				if (module_iter == replayed_shader_modules.end())
				{
					log_missing_resource("Shader module", module);
					return false;
				}
			}
			else
				iface.sync_shader_modules();

			state->module = module_iter->second;
		}
		else
			state->module = api_object_cast<VkShaderModule>(module);
	}

	*out_info = ret;
	return true;
}